

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::ListType::SharedDtor(ListType *this)

{
  ValueType *this_00;
  Dimension *this_01;
  Arena *pAVar1;
  LogMessage *other;
  ListType *pLVar2;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  ListType *local_10;
  ListType *this_local;
  
  local_10 = this;
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar1 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0xf40);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this_00 = this->type_, this_00 != (ValueType *)0x0)) {
    ValueType::~ValueType(this_00);
    operator_delete(this_00,0x20);
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this_01 = this->length_, this_01 != (Dimension *)0x0)) {
    Dimension::~Dimension(this_01);
    operator_delete(this_01,0x20);
  }
  return;
}

Assistant:

inline void ListType::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete type_;
  if (this != internal_default_instance()) delete length_;
}